

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Problem_CGBG_FF::TypeIndexToObservationIndices(Problem_CGBG_FF *this,Index agI,Index typeI)

{
  size_type __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  allocator_type *in_RDI;
  Problem_CGBG_FF *unaff_retaddr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *obsHouseIndices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *obsIndices;
  size_type in_stack_ffffffffffffff98;
  allocator_type *__a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  undefined1 local_21;
  const_reference local_20;
  allocator_type *paVar1;
  Index typeI_00;
  
  __a = in_RDI;
  paVar1 = in_RDI;
  local_20 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)in_RDI,in_stack_ffffffffffffff98);
  typeI_00 = (Index)((ulong)paVar1 >> 0x20);
  local_21 = 0;
  __n = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_20);
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffde;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8edc97);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(this_00,__n,__a);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8edcb7);
  TypeIndexToObservationIndices(unaff_retaddr,typeI_00,in_RSI);
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI;
}

Assistant:

vector<Index> Problem_CGBG_FF::TypeIndexToObservationIndices(
        Index agI, Index typeI) const
{
    const vector<Index> & obsHouseIndices = _m_houseIndices_obs.at(agI);
    vector<Index> obsIndices(obsHouseIndices.size());
    TypeIndexToObservationIndices(typeI, obsIndices);
    return obsIndices;
}